

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O3

Vector<float,_4> __thiscall
deqp::gls::FragmentOpUtil::triQuadInterpolate<tcu::Vector<float,4>>
          (FragmentOpUtil *this,Vector<float,_4> *values,float xFactor,float yFactor)

{
  undefined1 auVar1 [16];
  Vector<float,_4> *res;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (1.0 <= xFactor + yFactor) {
    fVar2 = values[3].m_data[0];
    fVar3 = values[3].m_data[1];
    fVar4 = values[3].m_data[2];
    fVar5 = values[3].m_data[3];
    fVar7 = 1.0 - xFactor;
    fVar6 = 1.0 - yFactor;
    fVar2 = fVar6 * (values[2].m_data[0] - fVar2) + fVar7 * (values[1].m_data[0] - fVar2) + fVar2;
    fVar3 = fVar6 * (values[2].m_data[1] - fVar3) + fVar7 * (values[1].m_data[1] - fVar3) + fVar3;
    fVar4 = fVar6 * (values[2].m_data[2] - fVar4) + fVar7 * (values[1].m_data[2] - fVar4) + fVar4;
    fVar5 = fVar6 * (values[2].m_data[3] - fVar5) + fVar7 * (values[1].m_data[3] - fVar5) + fVar5;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    fVar2 = values->m_data[0];
    fVar3 = values->m_data[1];
    fVar4 = values->m_data[2];
    fVar5 = values->m_data[3];
    fVar2 = yFactor * (values[1].m_data[0] - fVar2) +
            xFactor * (values[2].m_data[0] - fVar2) + fVar2;
    fVar3 = yFactor * (values[1].m_data[1] - fVar3) +
            xFactor * (values[2].m_data[1] - fVar3) + fVar3;
    fVar4 = yFactor * (values[1].m_data[2] - fVar4) +
            xFactor * (values[2].m_data[2] - fVar4) + fVar4;
    fVar5 = yFactor * (values[1].m_data[3] - fVar5) +
            xFactor * (values[2].m_data[3] - fVar5) + fVar5;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  *(float *)this = fVar2;
  *(float *)(this + 4) = fVar3;
  *(float *)(this + 8) = fVar4;
  *(float *)(this + 0xc) = fVar5;
  auVar1._4_4_ = fVar3;
  auVar1._0_4_ = fVar2;
  auVar1._8_8_ = 0;
  return (float  [4])(auVar1 << 0x40);
}

Assistant:

inline T triQuadInterpolate (const T values[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}